

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_matcher.cpp
# Opt level: O3

idx_t duckdb::TemplatedMatch<false,float,duckdb::DistinctFrom>
                (Vector *param_1,TupleDataVectorFormat *lhs_format,SelectionVector *sel,idx_t count,
                TupleDataLayout *rhs_layout,Vector *rhs_row_locations,idx_t col_idx,
                vector<duckdb::MatchFunction,_true> *param_8,SelectionVector *no_match_sel,
                idx_t *no_match_count)

{
  data_ptr_t pdVar1;
  SelectionVector *pSVar2;
  value_type vVar3;
  sel_t *psVar4;
  unsigned_long *puVar5;
  data_ptr_t pdVar6;
  const_reference pvVar7;
  sel_t *psVar8;
  idx_t iVar9;
  idx_t iVar10;
  idx_t iVar11;
  uint uVar12;
  idx_t iVar13;
  bool bVar14;
  float local_48;
  float local_44;
  ulong local_40;
  data_ptr_t local_38;
  
  local_40 = col_idx >> 3;
  if ((lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    pSVar2 = (lhs_format->unified).sel;
    pdVar1 = (lhs_format->unified).data;
    pdVar6 = rhs_row_locations->data;
    pvVar7 = vector<unsigned_long,_true>::operator[](&rhs_layout->offsets,col_idx);
    if (count != 0) {
      vVar3 = *pvVar7;
      iVar13 = 0;
      iVar11 = 0;
      do {
        psVar8 = sel->sel_vector;
        iVar10 = iVar11;
        if (psVar8 != (sel_t *)0x0) {
          iVar10 = (idx_t)psVar8[iVar11];
        }
        psVar4 = pSVar2->sel_vector;
        iVar9 = iVar10;
        if (psVar4 != (sel_t *)0x0) {
          iVar9 = (idx_t)psVar4[iVar10];
        }
        local_48 = *(float *)(*(long *)(pdVar6 + iVar10 * 8) + vVar3);
        if ((1 << ((byte)col_idx & 7) & (uint)*(byte *)(*(long *)(pdVar6 + iVar10 * 8) + local_40))
            == 0) {
LAB_015c62c9:
          psVar8[iVar13] = (sel_t)iVar10;
          iVar13 = iVar13 + 1;
        }
        else {
          bVar14 = Equals::Operation<float>((float *)(pdVar1 + iVar9 * 4),&local_48);
          if (!bVar14) {
            psVar8 = sel->sel_vector;
            goto LAB_015c62c9;
          }
        }
        iVar11 = iVar11 + 1;
        if (count == iVar11) {
          return iVar13;
        }
      } while( true );
    }
  }
  else {
    pdVar1 = rhs_row_locations->data;
    pSVar2 = (lhs_format->unified).sel;
    local_38 = (lhs_format->unified).data;
    pvVar7 = vector<unsigned_long,_true>::operator[](&rhs_layout->offsets,col_idx);
    if (count != 0) {
      vVar3 = *pvVar7;
      iVar13 = 0;
      iVar11 = 0;
      do {
        psVar8 = sel->sel_vector;
        iVar10 = iVar11;
        if (psVar8 != (sel_t *)0x0) {
          iVar10 = (idx_t)psVar8[iVar11];
        }
        psVar4 = pSVar2->sel_vector;
        iVar9 = iVar10;
        if (psVar4 != (sel_t *)0x0) {
          iVar9 = (idx_t)psVar4[iVar10];
        }
        puVar5 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.
                 validity_mask;
        if (puVar5 == (unsigned_long *)0x0) {
          bVar14 = false;
        }
        else {
          bVar14 = (puVar5[iVar9 >> 6] >> (iVar9 & 0x3f) & 1) == 0;
        }
        uVar12 = (uint)*(byte *)(*(long *)(pdVar1 + iVar10 * 8) + local_40) &
                 1 << ((byte)col_idx & 7);
        local_44 = *(float *)(*(long *)(pdVar1 + iVar10 * 8) + vVar3);
        if ((bVar14 == false) && (uVar12 != 0)) {
          bVar14 = Equals::Operation<float>((float *)(local_38 + iVar9 * 4),&local_44);
          if (!bVar14) {
            psVar8 = sel->sel_vector;
LAB_015c6200:
            psVar8[iVar13] = (sel_t)iVar10;
            iVar13 = iVar13 + 1;
          }
        }
        else if (bVar14 != (uVar12 == 0)) goto LAB_015c6200;
        iVar11 = iVar11 + 1;
        if (count == iVar11) {
          return iVar13;
        }
      } while( true );
    }
  }
  return 0;
}

Assistant:

static idx_t TemplatedMatch(Vector &, const TupleDataVectorFormat &lhs_format, SelectionVector &sel, const idx_t count,
                            const TupleDataLayout &rhs_layout, Vector &rhs_row_locations, const idx_t col_idx,
                            const vector<MatchFunction> &, SelectionVector *no_match_sel, idx_t &no_match_count) {
	if (lhs_format.unified.validity.AllValid()) {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, true>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                     col_idx, no_match_sel, no_match_count);
	} else {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, false>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                      col_idx, no_match_sel, no_match_count);
	}
}